

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
ccs::ast::Import::resolveImports
          (Import *this,ImportResolver *importResolver,Loader *loader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inProgress)

{
  Loader *pLVar1;
  bool bVar2;
  ostream *poVar3;
  CcsTracer *pCVar4;
  string local_3d0 [32];
  ostringstream local_3b0 [8];
  ostringstream msg_1;
  anon_class_32_4_b6eec043 local_238;
  function<bool_(std::basic_istream<char,_std::char_traits<char>_>_&)> local_218;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream msg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  byte local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inProgress_local;
  Loader *loader_local;
  ImportResolver *importResolver_local;
  Import *this_local;
  
  local_29 = 0;
  pvStack_28 = inProgress;
  inProgress_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)loader;
  loader_local = (Loader *)importResolver;
  importResolver_local = (ImportResolver *)this;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(inProgress);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvStack_28);
  local_38 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_40,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_48,&this->location);
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvStack_28);
  bVar2 = __gnu_cxx::operator!=(&local_38,&local_50);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar3 = std::operator<<((ostream *)local_1c8,"Circular import detected involving \'");
    poVar3 = std::operator<<(poVar3,(string *)&this->location);
    std::operator<<(poVar3,"\'");
    pCVar4 = Loader::tracer((Loader *)inProgress_local);
    std::__cxx11::ostringstream::str();
    (*pCVar4->_vptr_CcsTracer[5])(pCVar4,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvStack_28,&this->location);
    pLVar1 = loader_local;
    local_238.loader = (Loader *)inProgress_local;
    local_238.importResolver = (ImportResolver *)loader_local;
    local_238.inProgress = pvStack_28;
    local_238.this = this;
    std::function<bool(std::istream&)>::
    function<ccs::ast::Import::resolveImports(ccs::ImportResolver&,ccs::Loader&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0,void>
              ((function<bool(std::istream&)> *)&local_218,&local_238);
    local_29 = (*(code *)pLVar1->trace[2]._vptr_CcsTracer)(pLVar1,&this->location,&local_218);
    local_29 = local_29 & 1;
    std::function<bool_(std::basic_istream<char,_std::char_traits<char>_>_&)>::~function(&local_218)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(pvStack_28);
    if ((local_29 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_3b0);
      poVar3 = std::operator<<((ostream *)local_3b0,"Failed to resolve \'");
      poVar3 = std::operator<<(poVar3,(string *)&this->location);
      std::operator<<(poVar3,"\'! (User-provided resolver returned false.)");
      pCVar4 = Loader::tracer((Loader *)inProgress_local);
      std::__cxx11::ostringstream::str();
      (*pCVar4->_vptr_CcsTracer[5])(pCVar4,local_3d0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::ostringstream::~ostringstream(local_3b0);
    }
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool Import::resolveImports(ImportResolver &importResolver, Loader &loader,
    std::vector<std::string> &inProgress) {
  bool result = false;
  if (std::find(inProgress.begin(), inProgress.end(), location) !=
      inProgress.end()) {
    std::ostringstream msg;
    msg << "Circular import detected involving '" << location << "'";
    loader.tracer().onParseError(msg.str());
  } else {
    inProgress.push_back(location);
    result = importResolver.resolve(location,
        [&](std::istream &stream) {
      return loader.parseCcsStream(stream, location,
          importResolver, inProgress, ast);
    });
    inProgress.pop_back();
    if (!result) {
      std::ostringstream msg;
      msg << "Failed to resolve '" << location
        << "'! (User-provided resolver returned false.)";
      loader.tracer().onParseError(msg.str());
    }
  }
  return result;
}